

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

void cashew::ValueBuilder::appendCaseToSwitch(Ref switch_,Ref arg)

{
  Value *this;
  char cVar1;
  Ref *this_00;
  undefined8 *puVar2;
  Value *pVVar3;
  Value *this_01;
  Ref RVar4;
  Value *local_30;
  Ref switch__local;
  
  local_30 = switch_.inst;
  this_00 = (Ref *)cashew::Ref::operator[]((uint)&local_30);
  cVar1 = cashew::Ref::operator==(this_00,(IString *)&SWITCH);
  if (cVar1 != '\0') {
    puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&local_30);
    this = (Value *)*puVar2;
    pVVar3 = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
    pVVar3->type = Null;
    pVVar3 = Value::setArray(pVVar3,2);
    pVVar3 = Value::push_back(pVVar3,arg);
    this_01 = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
    this_01->type = Null;
    RVar4.inst = Value::setArray(this_01,0);
    RVar4.inst = Value::push_back(pVVar3,RVar4);
    Value::push_back(this,RVar4);
    return;
  }
  __assert_fail("switch_[0] == SWITCH",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x6e6,"static void cashew::ValueBuilder::appendCaseToSwitch(Ref, Ref)");
}

Assistant:

static void appendCaseToSwitch(Ref switch_, Ref arg) {
    assert(switch_[0] == SWITCH);
    switch_[2]->push_back(
      &makeRawArray(2)->push_back(arg).push_back(makeRawArray()));
  }